

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_Node4FullDeleteEndAndMiddle_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_Node4FullDeleteEndAndMiddle_Test
          (ARTCorrectnessTest_Node4FullDeleteEndAndMiddle_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTCorrectnessTest_Node4FullDeleteEndAndMiddle_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ~ARTCorrectnessTest_Node4FullDeleteEndAndMiddle_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node4FullDeleteEndAndMiddle) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(1, 4);

  // Delete from Node4 end
  unodb::test::must_not_allocate([&verifier] { verifier.remove(4); });

  verifier.check_present_values();
  verifier.check_absent_keys({4, 0, 5});

  // Delete from Node4 middle
  unodb::test::must_not_allocate([&verifier] { verifier.remove(2); });

  verifier.check_present_values();
  verifier.check_absent_keys({2, 4, 0, 5});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({2, 1, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}